

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWOTags(LWOImporter *this,uint size)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = this->mFileBuffer;
  puVar3 = puVar1 + size;
  puVar2 = puVar1;
  for (; puVar1 < puVar3; puVar1 = puVar1 + 1) {
    if (*puVar1 == '\0') {
      lVar4 = (long)puVar1 - (long)puVar2;
      if (lVar4 != 0) {
        this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->mTags;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar2,puVar2 + lVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      puVar1 = puVar1 + (2 - (ulong)((uint)lVar4 & 1));
      puVar2 = puVar1;
    }
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOTags(unsigned int size)
{
    // --- this function is used for both LWO2 and LWOB

    const char* szCur = (const char*)mFileBuffer, *szLast = szCur;
    const char* const szEnd = szLast+size;
    while (szCur < szEnd)
    {
        if (!(*szCur))
        {
            const size_t len = (size_t)(szCur-szLast);
            // FIX: skip empty-sized tags
            if (len)
                mTags->push_back(std::string(szLast,len));
            szCur += (len&0x1 ? 1 : 2);
            szLast = szCur;
        }
        szCur++;
    }
}